

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFontGlyphRangesBuilder::BuildRanges
          (ImFontGlyphRangesBuilder *this,ImVector<unsigned_short> *out_ranges)

{
  int iVar1;
  unsigned_short *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  uVar3 = 0;
  do {
    if ((this->UsedChars).Size <= (int)uVar3 >> 5) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x605,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    uVar6 = uVar3;
    if ((*(uint *)((long)(this->UsedChars).Data + ((long)((int)uVar3 >> 3) & 0xfffffffffffffffcU))
         >> (uVar3 & 0x1f) & 1) != 0) {
      iVar5 = out_ranges->Size;
      if (iVar5 == out_ranges->Capacity) {
        if (iVar5 == 0) {
          iVar1 = 8;
        }
        else {
          iVar1 = iVar5 / 2 + iVar5;
        }
        iVar4 = iVar5 + 1;
        if (iVar5 + 1 < iVar1) {
          iVar4 = iVar1;
        }
        puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar4 * 2);
        if (out_ranges->Data != (unsigned_short *)0x0) {
          memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = puVar2;
        out_ranges->Capacity = iVar4;
        iVar5 = out_ranges->Size;
      }
      else {
        puVar2 = out_ranges->Data;
      }
      puVar2[iVar5] = (unsigned_short)uVar3;
      out_ranges->Size = out_ranges->Size + 1;
      do {
        uVar6 = uVar3;
        if (uVar6 == 0xffff) break;
        uVar3 = uVar6 + 1;
        if ((this->UsedChars).Size <= (int)uVar3 >> 5) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x605,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
      } while ((*(uint *)((long)(this->UsedChars).Data +
                         ((long)((int)uVar3 >> 3) & 0xfffffffffffffffcU)) >> (uVar3 & 0x1f) & 1) !=
               0);
      iVar5 = out_ranges->Size;
      if (iVar5 == out_ranges->Capacity) {
        if (iVar5 == 0) {
          iVar1 = 8;
        }
        else {
          iVar1 = iVar5 / 2 + iVar5;
        }
        iVar4 = iVar5 + 1;
        if (iVar5 + 1 < iVar1) {
          iVar4 = iVar1;
        }
        puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar4 * 2);
        if (out_ranges->Data != (unsigned_short *)0x0) {
          memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = puVar2;
        out_ranges->Capacity = iVar4;
        iVar5 = out_ranges->Size;
      }
      else {
        puVar2 = out_ranges->Data;
      }
      puVar2[iVar5] = (unsigned_short)uVar6;
      out_ranges->Size = out_ranges->Size + 1;
    }
    uVar3 = uVar6 + 1;
    if (0xfffe < (int)uVar6) {
      iVar5 = out_ranges->Size;
      if (iVar5 == out_ranges->Capacity) {
        if (iVar5 == 0) {
          iVar1 = 8;
        }
        else {
          iVar1 = iVar5 / 2 + iVar5;
        }
        iVar4 = iVar5 + 1;
        if (iVar5 + 1 < iVar1) {
          iVar4 = iVar1;
        }
        puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar4 * 2);
        if (out_ranges->Data != (unsigned_short *)0x0) {
          memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = puVar2;
        out_ranges->Capacity = iVar4;
        iVar5 = out_ranges->Size;
      }
      else {
        puVar2 = out_ranges->Data;
      }
      puVar2[iVar5] = 0;
      out_ranges->Size = out_ranges->Size + 1;
      return;
    }
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    const int max_codepoint = IM_UNICODE_CODEPOINT_MAX;
    for (int n = 0; n <= max_codepoint; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < max_codepoint && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}